

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

int __thiscall
zmq::options_t::getsockopt
          (options_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  undefined4 in_register_0000000c;
  size_t *optvallen_;
  undefined4 in_register_00000014;
  uint64_t *optval_;
  string *value_;
  ulong __n;
  
  optval_ = (uint64_t *)CONCAT44(in_register_00000014,__level);
  optvallen_ = (size_t *)CONCAT44(in_register_0000000c,__optname);
  if (0x6c < __fd - 4U) goto switchD_001d87c7_caseD_6;
  uVar1 = *optvallen_;
  switch(__fd) {
  case 4:
    if (uVar1 == 8) {
      *optval_ = this->affinity;
      return 0;
    }
    break;
  case 5:
    __n = (ulong)this->routing_id_size;
    if (__n <= uVar1) {
      memcpy(optval_,this->routing_id,__n);
      memset((void *)((long)optval_ + __n),0,*optvallen_ - __n);
      *optvallen_ = __n;
      return 0;
    }
    break;
  case 8:
    if (uVar1 == 4) {
      uVar2 = this->rate;
LAB_001d8c03:
      *(uint *)optval_ = uVar2;
      return 0;
    }
    break;
  case 9:
    if (uVar1 == 4) {
      uVar2 = this->recovery_ivl;
      goto LAB_001d8c03;
    }
    break;
  case 0xb:
    if (uVar1 == 4) {
      uVar2 = this->sndbuf;
      goto LAB_001d8c03;
    }
    break;
  case 0xc:
    if (uVar1 == 4) {
      uVar2 = this->rcvbuf;
      goto LAB_001d8c03;
    }
    break;
  case 0x10:
    if (uVar1 == 4) {
      uVar2 = (uint)this->type;
      goto LAB_001d8c03;
    }
    break;
  case 0x11:
    if (uVar1 == 4) {
      uVar2 = (this->linger)._value.super___atomic_base<int>._M_i;
      goto LAB_001d8c03;
    }
    break;
  case 0x12:
    if (uVar1 == 4) {
      uVar2 = this->reconnect_ivl;
      goto LAB_001d8c03;
    }
    break;
  case 0x13:
    if (uVar1 == 4) {
      uVar2 = this->backlog;
      goto LAB_001d8c03;
    }
    break;
  case 0x15:
    if (uVar1 == 4) {
      uVar2 = this->reconnect_ivl_max;
      goto LAB_001d8c03;
    }
    break;
  case 0x16:
    if (uVar1 == 8) {
      *optval_ = this->maxmsgsize;
      *optvallen_ = 8;
      return 0;
    }
    break;
  case 0x17:
    if (uVar1 == 4) {
      uVar2 = this->sndhwm;
      goto LAB_001d8c03;
    }
    break;
  case 0x18:
    if (uVar1 == 4) {
      uVar2 = this->rcvhwm;
      goto LAB_001d8c03;
    }
    break;
  case 0x19:
    if (uVar1 == 4) {
      uVar2 = this->multicast_hops;
      goto LAB_001d8c03;
    }
    break;
  case 0x1b:
    if (uVar1 == 4) {
      uVar2 = this->rcvtimeo;
      goto LAB_001d8c03;
    }
    break;
  case 0x1c:
    if (uVar1 == 4) {
      uVar2 = this->sndtimeo;
      goto LAB_001d8c03;
    }
    break;
  case 0x1f:
    if (uVar1 == 4) {
      uVar2 = this->ipv6 ^ 1;
      goto LAB_001d8c03;
    }
    break;
  case 0x22:
    if (uVar1 == 4) {
      uVar2 = this->tcp_keepalive;
      goto LAB_001d8c03;
    }
    break;
  case 0x23:
    if (uVar1 == 4) {
      uVar2 = this->tcp_keepalive_cnt;
      goto LAB_001d8c03;
    }
    break;
  case 0x24:
    if (uVar1 == 4) {
      uVar2 = this->tcp_keepalive_idle;
      goto LAB_001d8c03;
    }
    break;
  case 0x25:
    if (uVar1 == 4) {
      uVar2 = this->tcp_keepalive_intvl;
      goto LAB_001d8c03;
    }
    break;
  case 0x27:
    if (uVar1 == 4) {
      uVar2 = this->immediate;
      goto LAB_001d8c03;
    }
    break;
  case 0x2a:
    if (uVar1 == 4) {
      uVar2 = (uint)this->ipv6;
      goto LAB_001d8c03;
    }
    break;
  case 0x2b:
    if (uVar1 == 4) {
      uVar2 = this->mechanism;
      goto LAB_001d8c03;
    }
    break;
  case 0x2c:
    if (uVar1 == 4) {
      uVar2 = (uint)(this->mechanism == 1 && this->as_server != 0);
      goto LAB_001d8c03;
    }
    break;
  case 0x2d:
    value_ = &this->plain_username;
    goto LAB_001d8be2;
  case 0x2e:
    value_ = &this->plain_password;
    goto LAB_001d8be2;
  case 0x36:
    if (uVar1 == 4) {
      uVar2 = (uint)this->conflate;
      goto LAB_001d8c03;
    }
    break;
  case 0x37:
    value_ = &this->zap_domain;
    goto LAB_001d8be2;
  case 0x39:
    if (uVar1 == 4) {
      uVar2 = this->tos;
      goto LAB_001d8c03;
    }
    break;
  case 0x42:
    if (uVar1 == 4) {
      uVar2 = this->handshake_ivl;
      goto LAB_001d8c03;
    }
    break;
  case 0x44:
    value_ = &this->socks_proxy_address;
    goto LAB_001d8be2;
  case 0x4a:
    if (uVar1 == 4) {
      uVar2 = (uint)this->invert_matching;
      goto LAB_001d8c03;
    }
    break;
  case 0x4b:
    if (uVar1 == 4) {
      uVar2 = this->heartbeat_interval;
      goto LAB_001d8c03;
    }
    break;
  case 0x4c:
    if (uVar1 == 4) {
      uVar2 = (uint)this->heartbeat_ttl * 100;
      goto LAB_001d8c03;
    }
    break;
  case 0x4d:
    if (uVar1 == 4) {
      uVar2 = this->heartbeat_timeout;
      goto LAB_001d8c03;
    }
    break;
  case 0x4f:
    if (uVar1 == 4) {
      uVar2 = this->connect_timeout;
      goto LAB_001d8c03;
    }
    break;
  case 0x50:
    if (uVar1 == 4) {
      uVar2 = this->tcp_maxrt;
      goto LAB_001d8c03;
    }
    break;
  case 0x54:
    if (uVar1 == 4) {
      uVar2 = this->multicast_maxtpdu;
      goto LAB_001d8c03;
    }
    break;
  case 0x59:
    if (uVar1 == 4) {
      uVar2 = this->use_fd;
      goto LAB_001d8c03;
    }
    break;
  case 0x5c:
    value_ = &this->bound_device;
    goto LAB_001d8be2;
  case 0x5d:
    if (uVar1 == 4) {
      uVar2 = (uint)this->zap_enforce_domain;
      goto LAB_001d8c03;
    }
    break;
  case 0x5e:
    if (uVar1 == 4) {
      uVar2 = (uint)this->loopback_fastpath;
      goto LAB_001d8c03;
    }
    break;
  case 0x60:
    if (uVar1 == 4) {
      uVar2 = (uint)this->multicast_loop;
      goto LAB_001d8c03;
    }
    break;
  case 0x61:
    if (uVar1 == 4) {
      uVar2 = this->router_notify;
      goto LAB_001d8c03;
    }
    break;
  case 99:
    value_ = &this->socks_proxy_username;
    goto LAB_001d8be2;
  case 100:
    value_ = &this->socks_proxy_password;
LAB_001d8be2:
    iVar3 = do_getsockopt(optval_,optvallen_,value_);
    return iVar3;
  case 0x65:
    if (uVar1 == 4) {
      uVar2 = this->in_batch_size;
      goto LAB_001d8c03;
    }
    break;
  case 0x66:
    if (uVar1 == 4) {
      uVar2 = this->out_batch_size;
      goto LAB_001d8c03;
    }
    break;
  case 0x6d:
    if (uVar1 == 4) {
      uVar2 = this->reconnect_stop;
      goto LAB_001d8c03;
    }
    break;
  case 0x70:
    if (uVar1 == 4) {
      uVar2 = this->priority;
      goto LAB_001d8c03;
    }
  }
switchD_001d87c7_caseD_6:
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return -1;
}

Assistant:

int zmq::options_t::getsockopt (int option_,
                                void *optval_,
                                size_t *optvallen_) const
{
    const bool is_int = (*optvallen_ == sizeof (int));
    int *value = static_cast<int *> (optval_);
#if defined(ZMQ_ACT_MILITANT)
    bool malformed = true; //  Did caller pass a bad option value?
#endif

    switch (option_) {
        case ZMQ_SNDHWM:
            if (is_int) {
                *value = sndhwm;
                return 0;
            }
            break;

        case ZMQ_RCVHWM:
            if (is_int) {
                *value = rcvhwm;
                return 0;
            }
            break;

        case ZMQ_AFFINITY:
            if (*optvallen_ == sizeof (uint64_t)) {
                *(static_cast<uint64_t *> (optval_)) = affinity;
                return 0;
            }
            break;

        case ZMQ_ROUTING_ID:
            return do_getsockopt (optval_, optvallen_, routing_id,
                                  routing_id_size);

        case ZMQ_RATE:
            if (is_int) {
                *value = rate;
                return 0;
            }
            break;

        case ZMQ_RECOVERY_IVL:
            if (is_int) {
                *value = recovery_ivl;
                return 0;
            }
            break;

        case ZMQ_SNDBUF:
            if (is_int) {
                *value = sndbuf;
                return 0;
            }
            break;

        case ZMQ_RCVBUF:
            if (is_int) {
                *value = rcvbuf;
                return 0;
            }
            break;

        case ZMQ_TOS:
            if (is_int) {
                *value = tos;
                return 0;
            }
            break;

        case ZMQ_TYPE:
            if (is_int) {
                *value = type;
                return 0;
            }
            break;

        case ZMQ_LINGER:
            if (is_int) {
                *value = linger.load ();
                return 0;
            }
            break;

        case ZMQ_CONNECT_TIMEOUT:
            if (is_int) {
                *value = connect_timeout;
                return 0;
            }
            break;

        case ZMQ_TCP_MAXRT:
            if (is_int) {
                *value = tcp_maxrt;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_STOP:
            if (is_int) {
                *value = reconnect_stop;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL:
            if (is_int) {
                *value = reconnect_ivl;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL_MAX:
            if (is_int) {
                *value = reconnect_ivl_max;
                return 0;
            }
            break;

        case ZMQ_BACKLOG:
            if (is_int) {
                *value = backlog;
                return 0;
            }
            break;

        case ZMQ_MAXMSGSIZE:
            if (*optvallen_ == sizeof (int64_t)) {
                *(static_cast<int64_t *> (optval_)) = maxmsgsize;
                *optvallen_ = sizeof (int64_t);
                return 0;
            }
            break;

        case ZMQ_MULTICAST_HOPS:
            if (is_int) {
                *value = multicast_hops;
                return 0;
            }
            break;

        case ZMQ_MULTICAST_MAXTPDU:
            if (is_int) {
                *value = multicast_maxtpdu;
                return 0;
            }
            break;

        case ZMQ_RCVTIMEO:
            if (is_int) {
                *value = rcvtimeo;
                return 0;
            }
            break;

        case ZMQ_SNDTIMEO:
            if (is_int) {
                *value = sndtimeo;
                return 0;
            }
            break;

        case ZMQ_IPV4ONLY:
            if (is_int) {
                *value = 1 - ipv6;
                return 0;
            }
            break;

        case ZMQ_IPV6:
            if (is_int) {
                *value = ipv6;
                return 0;
            }
            break;

        case ZMQ_IMMEDIATE:
            if (is_int) {
                *value = immediate;
                return 0;
            }
            break;

        case ZMQ_SOCKS_PROXY:
            return do_getsockopt (optval_, optvallen_, socks_proxy_address);

        case ZMQ_SOCKS_USERNAME:
            return do_getsockopt (optval_, optvallen_, socks_proxy_username);

        case ZMQ_SOCKS_PASSWORD:
            return do_getsockopt (optval_, optvallen_, socks_proxy_password);

        case ZMQ_TCP_KEEPALIVE:
            if (is_int) {
                *value = tcp_keepalive;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_CNT:
            if (is_int) {
                *value = tcp_keepalive_cnt;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_IDLE:
            if (is_int) {
                *value = tcp_keepalive_idle;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_INTVL:
            if (is_int) {
                *value = tcp_keepalive_intvl;
                return 0;
            }
            break;

        case ZMQ_MECHANISM:
            if (is_int) {
                *value = mechanism;
                return 0;
            }
            break;

        case ZMQ_PLAIN_SERVER:
            if (is_int) {
                *value = as_server && mechanism == ZMQ_PLAIN;
                return 0;
            }
            break;

        case ZMQ_PLAIN_USERNAME:
            return do_getsockopt (optval_, optvallen_, plain_username);

        case ZMQ_PLAIN_PASSWORD:
            return do_getsockopt (optval_, optvallen_, plain_password);

        case ZMQ_ZAP_DOMAIN:
            return do_getsockopt (optval_, optvallen_, zap_domain);

            //  If curve encryption isn't built, these options provoke EINVAL
#ifdef ZMQ_HAVE_CURVE
        case ZMQ_CURVE_SERVER:
            if (is_int) {
                *value = as_server && mechanism == ZMQ_CURVE;
                return 0;
            }
            break;

        case ZMQ_CURVE_PUBLICKEY:
            return do_getsockopt_curve_key (optval_, optvallen_,
                                            curve_public_key);

        case ZMQ_CURVE_SECRETKEY:
            return do_getsockopt_curve_key (optval_, optvallen_,
                                            curve_secret_key);

        case ZMQ_CURVE_SERVERKEY:
            return do_getsockopt_curve_key (optval_, optvallen_,
                                            curve_server_key);
#endif

        case ZMQ_CONFLATE:
            if (is_int) {
                *value = conflate;
                return 0;
            }
            break;

            //  If libgssapi isn't installed, these options provoke EINVAL
#ifdef HAVE_LIBGSSAPI_KRB5
        case ZMQ_GSSAPI_SERVER:
            if (is_int) {
                *value = as_server && mechanism == ZMQ_GSSAPI;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PRINCIPAL:
            return do_getsockopt (optval_, optvallen_, gss_principal);

        case ZMQ_GSSAPI_SERVICE_PRINCIPAL:
            return do_getsockopt (optval_, optvallen_, gss_service_principal);

        case ZMQ_GSSAPI_PLAINTEXT:
            if (is_int) {
                *value = gss_plaintext;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PRINCIPAL_NAMETYPE:
            if (is_int) {
                *value = gss_principal_nt;
                return 0;
            }
            break;
        case ZMQ_GSSAPI_SERVICE_PRINCIPAL_NAMETYPE:
            if (is_int) {
                *value = gss_service_principal_nt;
                return 0;
            }
            break;
#endif

        case ZMQ_HANDSHAKE_IVL:
            if (is_int) {
                *value = handshake_ivl;
                return 0;
            }
            break;

        case ZMQ_INVERT_MATCHING:
            if (is_int) {
                *value = invert_matching;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_IVL:
            if (is_int) {
                *value = heartbeat_interval;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TTL:
            if (is_int) {
                // Convert the internal deciseconds value to milliseconds
                *value = heartbeat_ttl * 100;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TIMEOUT:
            if (is_int) {
                *value = heartbeat_timeout;
                return 0;
            }
            break;

        case ZMQ_USE_FD:
            if (is_int) {
                *value = use_fd;
                return 0;
            }
            break;

        case ZMQ_BINDTODEVICE:
            return do_getsockopt (optval_, optvallen_, bound_device);

        case ZMQ_ZAP_ENFORCE_DOMAIN:
            if (is_int) {
                *value = zap_enforce_domain;
                return 0;
            }
            break;

        case ZMQ_LOOPBACK_FASTPATH:
            if (is_int) {
                *value = loopback_fastpath;
                return 0;
            }
            break;

        case ZMQ_MULTICAST_LOOP:
            if (is_int) {
                *value = multicast_loop;
                return 0;
            }
            break;

#ifdef ZMQ_BUILD_DRAFT_API
        case ZMQ_ROUTER_NOTIFY:
            if (is_int) {
                *value = router_notify;
                return 0;
            }
            break;

        case ZMQ_IN_BATCH_SIZE:
            if (is_int) {
                *value = in_batch_size;
                return 0;
            }
            break;

        case ZMQ_OUT_BATCH_SIZE:
            if (is_int) {
                *value = out_batch_size;
                return 0;
            }
            break;

        case ZMQ_PRIORITY:
            if (is_int) {
                *value = priority;
                return 0;
            }
            break;
#endif


        default:
#if defined(ZMQ_ACT_MILITANT)
            malformed = false;
#endif
            break;
    }
#if defined(ZMQ_ACT_MILITANT)
    if (malformed)
        zmq_assert (false);
#endif
    errno = EINVAL;
    return -1;
}